

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BoyerMooreSkipTables.h
# Opt level: O0

bool __thiscall
axl::sl::BoyerMooreGoodSkipTableBase<char>::build
          (BoyerMooreGoodSkipTableBase<char> *this,char *pattern,size_t patternLength)

{
  bool bVar1;
  unsigned_long uVar2;
  unsigned_long *puVar3;
  size_t sVar4;
  size_t in_RDX;
  char *in_RSI;
  size_t suffixLength;
  intptr_t i_1;
  intptr_t i;
  intptr_t lastPrefixPos;
  Rwi rwi;
  bool result;
  Array<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_> *in_stack_ffffffffffffff98;
  Array<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_> *in_stack_ffffffffffffffa0;
  ulong local_48;
  size_t local_40;
  size_t local_38;
  Rwi local_30;
  undefined1 local_21;
  size_t local_20;
  char *local_18;
  bool local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_21 = Array<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>::setCount
                       (in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98);
  if ((bool)local_21) {
    Array<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>::Rwi::Rwi
              ((Rwi *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    local_38 = local_20 - 1;
    sVar4 = local_20;
    while (local_40 = sVar4 - 1, -1 < (long)local_40) {
      bVar1 = isPrefix(local_18,local_20,sVar4);
      if (!bVar1) {
        sVar4 = local_38;
      }
      local_38 = sVar4;
      uVar2 = (local_38 + local_20 + -1) - local_40;
      puVar3 = Array<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>::Rwi::operator[]
                         (&local_30,local_40);
      *puVar3 = uVar2;
      sVar4 = local_40;
    }
    for (local_48 = 0; local_48 < local_20 - 1; local_48 = local_48 + 1) {
      sVar4 = calcSuffixLength(local_18,local_20,local_48);
      if (local_18[local_48 - sVar4] != local_18[(local_20 - 1) - sVar4]) {
        uVar2 = ((local_20 - 1) - local_48) + sVar4;
        puVar3 = Array<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>::Rwi::operator[]
                           (&local_30,(local_20 - 1) - sVar4);
        *puVar3 = uVar2;
      }
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool
	build(
		const C* pattern,
		size_t patternLength
	) {
		bool result = m_table.setCount(patternLength);
		if (!result)
			return false;

		sl::Array<size_t>::Rwi rwi = m_table;
		intptr_t lastPrefixPos = patternLength - 1;
		for (intptr_t i = patternLength - 1; i >= 0; i--) {
			if (isPrefix(pattern, patternLength, i + 1))
				lastPrefixPos = i + 1;

			rwi[i] = lastPrefixPos + patternLength - 1 - i;
		}

		for (intptr_t i = 0; i < patternLength - 1; i++) {
			size_t suffixLength = calcSuffixLength(pattern, patternLength, i);
			if (pattern[i - suffixLength] != pattern[patternLength - 1 - suffixLength])
				rwi[patternLength - 1 - suffixLength] = patternLength - 1 - i + suffixLength;
		}

		return true;
	}